

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIStaticText::breakText(CGUIStaticText *this)

{
  int iVar1;
  u32 uVar2;
  int iVar3;
  s32 sVar4;
  long *plVar5;
  array<irr::core::string<wchar_t>_> *paVar6;
  wchar_t *pwVar7;
  long *in_RDI;
  bool bVar8;
  s32 wordlgth_1;
  s32 whitelgth_1;
  bool lineBreak_1;
  s32 i_1;
  s32 secondLength;
  stringw second;
  stringw first;
  int where;
  s32 wordlgth;
  s32 whitelgth;
  bool isWhitespace;
  bool lineBreak;
  s32 i;
  wchar_t c;
  s32 elWidth;
  s32 length;
  s32 size;
  stringw whitespace;
  stringw word;
  stringw line;
  IGUIFont *font;
  IGUISkin *skin;
  array<irr::core::string<wchar_t>_> *in_stack_fffffffffffffd18;
  array<irr::core::string<wchar_t>_> *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  s32 in_stack_fffffffffffffd2c;
  array<irr::core::string<wchar_t>_> *in_stack_fffffffffffffd30;
  array<irr::core::string<wchar_t>_> *in_stack_fffffffffffffd38;
  array<irr::core::string<wchar_t>_> *in_stack_fffffffffffffd40;
  bool local_2a9;
  s32 in_stack_fffffffffffffd60;
  u32 in_stack_fffffffffffffd64;
  string<wchar_t> *in_stack_fffffffffffffd68;
  u32 local_140;
  int local_8c;
  wchar_t local_88;
  int local_84;
  int local_80;
  u32 local_7c;
  
  if ((*(byte *)((long)in_RDI + 0x13f) & 1) != 0) {
    core::array<irr::core::string<wchar_t>_>::clear(in_stack_fffffffffffffd30);
    plVar5 = (long *)(**(code **)(*(long *)in_RDI[0x25] + 0x60))();
    paVar6 = (array<irr::core::string<wchar_t>_> *)(**(code **)(*in_RDI + 0x130))();
    if (paVar6 != (array<irr::core::string<wchar_t>_> *)0x0) {
      in_RDI[0x2b] = (long)paVar6;
      core::string<wchar_t>::string((string<wchar_t> *)0x3ccfec);
      core::string<wchar_t>::string((string<wchar_t> *)0x3ccff9);
      core::string<wchar_t>::string((string<wchar_t> *)0x3cd006);
      local_140 = core::string<wchar_t>::size((string<wchar_t> *)0x3cd017);
      local_80 = 0;
      local_84 = core::rect<int>::getWidth((rect<int> *)(in_RDI + 6));
      if ((*(byte *)((long)in_RDI + 0x13c) & 1) != 0) {
        iVar1 = (**(code **)(*plVar5 + 0x10))(plVar5,8);
        local_84 = local_84 + iVar1 * -2;
      }
      if ((*(byte *)((long)in_RDI + 0x142) & 1) == 0) {
        local_7c = local_140;
        for (local_8c = 0; local_8c < (int)local_7c; local_8c = local_8c + 1) {
          pwVar7 = core::string<wchar_t>::operator[]
                             ((string<wchar_t> *)in_stack_fffffffffffffd20,
                              (u32)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          local_88 = *pwVar7;
          if (local_88 == L'\r') {
            bVar8 = true;
            pwVar7 = core::string<wchar_t>::operator[]
                               ((string<wchar_t> *)in_stack_fffffffffffffd20,
                                (u32)((ulong)in_stack_fffffffffffffd18 >> 0x20));
            if (*pwVar7 == L'\n') {
              core::string<wchar_t>::erase
                        ((string<wchar_t> *)in_stack_fffffffffffffd40,
                         (u32)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              local_7c = local_7c - 1;
            }
            local_88 = L'\0';
          }
          else {
            bVar8 = local_88 == L'\n';
            if (bVar8) {
              local_88 = L'\0';
            }
          }
          local_2a9 = local_88 == L' ' || local_88 == L'\0';
          if ((local_88 == L' ' || local_88 == L'\0') ||
             (core::string<wchar_t>::operator+=
                        ((string<wchar_t> *)in_stack_fffffffffffffd20,
                         (wchar_t)((ulong)in_stack_fffffffffffffd18 >> 0x20)),
             local_8c == local_7c - 1)) {
            uVar2 = core::string<wchar_t>::size((string<wchar_t> *)0x3cd1d3);
            if (uVar2 != 0) {
              in_stack_fffffffffffffd40 = paVar6;
              pwVar7 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3cd1f6);
              iVar1 = (**(code **)&((in_stack_fffffffffffffd40->m_data).
                                    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->field_0x8)
                                (in_stack_fffffffffffffd40,pwVar7);
              pwVar7 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3cd234);
              iVar3 = (**(code **)&((paVar6->m_data).
                                    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->field_0x8)
                                (paVar6,pwVar7);
              if (local_84 < iVar3) {
                sVar4 = core::string<wchar_t>::findFirst
                                  ((string<wchar_t> *)in_stack_fffffffffffffd20,
                                   (wchar_t)((ulong)in_stack_fffffffffffffd18 >> 0x20));
                if (sVar4 == -1) {
                  if (local_80 != 0) {
                    core::array<irr::core::string<wchar_t>_>::push_back
                              (in_stack_fffffffffffffd20,
                               (string<wchar_t> *)in_stack_fffffffffffffd18);
                  }
                  core::string<wchar_t>::operator=
                            ((string<wchar_t> *)
                             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                             (string<wchar_t> *)in_stack_fffffffffffffd20);
                  local_80 = iVar3;
                }
                else {
                  core::string<wchar_t>::subString
                            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                             in_stack_fffffffffffffd60,SUB81((ulong)in_RDI >> 0x38,0));
                  core::string<wchar_t>::size((string<wchar_t> *)0x3cd2cd);
                  core::string<wchar_t>::subString
                            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                             in_stack_fffffffffffffd60,SUB81((ulong)in_RDI >> 0x38,0));
                  in_stack_fffffffffffffd30 = (array<irr::core::string<wchar_t>_> *)(in_RDI + 0x2c);
                  core::string<wchar_t>::operator+
                            ((string<wchar_t> *)in_stack_fffffffffffffd38,
                             (string<wchar_t> *)in_stack_fffffffffffffd30);
                  core::string<wchar_t>::operator+
                            ((string<wchar_t> *)in_stack_fffffffffffffd38,
                             (wchar_t *)in_stack_fffffffffffffd30);
                  core::array<irr::core::string<wchar_t>_>::push_back
                            (in_stack_fffffffffffffd20,(string<wchar_t> *)in_stack_fffffffffffffd18)
                  ;
                  core::string<wchar_t>::~string((string<wchar_t> *)0x3cd35a);
                  core::string<wchar_t>::~string((string<wchar_t> *)0x3cd367);
                  in_stack_fffffffffffffd38 = paVar6;
                  pwVar7 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3cd381);
                  local_80 = (**(code **)&((in_stack_fffffffffffffd38->m_data).
                                           super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->field_0x8)
                                       (in_stack_fffffffffffffd38,pwVar7);
                  core::string<wchar_t>::operator=
                            ((string<wchar_t> *)CONCAT44(sVar4,in_stack_fffffffffffffd28),
                             (string<wchar_t> *)in_stack_fffffffffffffd20);
                  core::string<wchar_t>::~string((string<wchar_t> *)0x3cd3d5);
                  core::string<wchar_t>::~string((string<wchar_t> *)0x3cd3e2);
                  in_stack_fffffffffffffd2c = sVar4;
                }
              }
              else if ((local_80 == 0) || (local_80 + iVar3 + iVar1 <= local_84)) {
                core::string<wchar_t>::operator+=
                          ((string<wchar_t> *)in_stack_fffffffffffffd20,
                           (string<wchar_t> *)in_stack_fffffffffffffd18);
                core::string<wchar_t>::operator+=
                          ((string<wchar_t> *)in_stack_fffffffffffffd20,
                           (string<wchar_t> *)in_stack_fffffffffffffd18);
                local_80 = iVar1 + iVar3 + local_80;
              }
              else {
                core::array<irr::core::string<wchar_t>_>::push_back
                          (in_stack_fffffffffffffd20,(string<wchar_t> *)in_stack_fffffffffffffd18);
                core::string<wchar_t>::operator=
                          ((string<wchar_t> *)
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                           (string<wchar_t> *)in_stack_fffffffffffffd20);
                local_80 = iVar3;
              }
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
            }
            if (local_2a9) {
              core::string<wchar_t>::operator+=
                        ((string<wchar_t> *)in_stack_fffffffffffffd20,
                         (wchar_t)((ulong)in_stack_fffffffffffffd18 >> 0x20));
            }
            if (bVar8) {
              core::string<wchar_t>::operator+=
                        ((string<wchar_t> *)in_stack_fffffffffffffd20,
                         (string<wchar_t> *)in_stack_fffffffffffffd18);
              core::string<wchar_t>::operator+=
                        ((string<wchar_t> *)in_stack_fffffffffffffd20,
                         (string<wchar_t> *)in_stack_fffffffffffffd18);
              core::array<irr::core::string<wchar_t>_>::push_back
                        (in_stack_fffffffffffffd20,(string<wchar_t> *)in_stack_fffffffffffffd18);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              local_80 = 0;
            }
          }
        }
        core::string<wchar_t>::operator+=
                  ((string<wchar_t> *)in_stack_fffffffffffffd20,
                   (string<wchar_t> *)in_stack_fffffffffffffd18);
        core::string<wchar_t>::operator+=
                  ((string<wchar_t> *)in_stack_fffffffffffffd20,
                   (string<wchar_t> *)in_stack_fffffffffffffd18);
        core::array<irr::core::string<wchar_t>_>::push_back
                  (in_stack_fffffffffffffd20,(string<wchar_t> *)in_stack_fffffffffffffd18);
      }
      else {
        for (; -1 < (int)local_140; local_140 = local_140 - 1) {
          pwVar7 = core::string<wchar_t>::operator[]
                             ((string<wchar_t> *)in_stack_fffffffffffffd20,
                              (u32)((ulong)in_stack_fffffffffffffd18 >> 0x20));
          local_88 = *pwVar7;
          if (local_88 == L'\r') {
            bVar8 = true;
            if ((0 < (int)local_140) &&
               (pwVar7 = core::string<wchar_t>::operator[]
                                   ((string<wchar_t> *)in_stack_fffffffffffffd20,
                                    (u32)((ulong)in_stack_fffffffffffffd18 >> 0x20)),
               *pwVar7 == L'\n')) {
              core::string<wchar_t>::erase
                        ((string<wchar_t> *)in_stack_fffffffffffffd40,
                         (u32)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            }
            local_88 = L'\0';
          }
          else {
            bVar8 = local_88 == L'\n';
            if (bVar8) {
              local_88 = L'\0';
            }
          }
          if (((local_88 == L' ') || (local_88 == L'\0')) || (local_140 == 0)) {
            uVar2 = core::string<wchar_t>::size((string<wchar_t> *)0x3cd725);
            if (uVar2 != 0) {
              in_stack_fffffffffffffd18 = paVar6;
              pwVar7 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3cd747);
              iVar1 = (**(code **)&((in_stack_fffffffffffffd18->m_data).
                                    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->field_0x8)
                                (in_stack_fffffffffffffd18,pwVar7);
              in_stack_fffffffffffffd20 = paVar6;
              pwVar7 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3cd784);
              iVar3 = (**(code **)&((in_stack_fffffffffffffd20->m_data).
                                    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->field_0x8)
                                (in_stack_fffffffffffffd20,pwVar7);
              if ((local_80 == 0) || (local_80 + iVar3 + iVar1 <= local_84)) {
                core::string<wchar_t>::operator+
                          ((string<wchar_t> *)in_stack_fffffffffffffd38,
                           (string<wchar_t> *)in_stack_fffffffffffffd30);
                core::string<wchar_t>::operator=
                          ((string<wchar_t> *)
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                           (string<wchar_t> *)in_stack_fffffffffffffd20);
                core::string<wchar_t>::~string((string<wchar_t> *)0x3cd850);
                core::string<wchar_t>::operator+
                          ((string<wchar_t> *)in_stack_fffffffffffffd38,
                           (string<wchar_t> *)in_stack_fffffffffffffd30);
                core::string<wchar_t>::operator=
                          ((string<wchar_t> *)
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                           (string<wchar_t> *)in_stack_fffffffffffffd20);
                core::string<wchar_t>::~string((string<wchar_t> *)0x3cd88f);
                local_80 = iVar1 + iVar3 + local_80;
              }
              else {
                core::array<irr::core::string<wchar_t>_>::push_back
                          (in_stack_fffffffffffffd20,(string<wchar_t> *)in_stack_fffffffffffffd18);
                core::string<wchar_t>::operator=
                          ((string<wchar_t> *)
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                           (string<wchar_t> *)in_stack_fffffffffffffd20);
                local_80 = iVar3;
              }
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
            }
            if (local_88 != L'\0') {
              core::string<wchar_t>::string<wchar_t>
                        ((string<wchar_t> *)in_stack_fffffffffffffd30,
                         (wchar_t *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (u32)((ulong)in_stack_fffffffffffffd20 >> 0x20));
              core::string<wchar_t>::operator+
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (string<wchar_t> *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (string<wchar_t> *)in_stack_fffffffffffffd20);
              core::string<wchar_t>::~string((string<wchar_t> *)0x3cd936);
              core::string<wchar_t>::~string((string<wchar_t> *)0x3cd943);
            }
            if (bVar8) {
              core::string<wchar_t>::operator+
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (string<wchar_t> *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (string<wchar_t> *)in_stack_fffffffffffffd20);
              core::string<wchar_t>::~string((string<wchar_t> *)0x3cd990);
              core::string<wchar_t>::operator+
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (string<wchar_t> *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (string<wchar_t> *)in_stack_fffffffffffffd20);
              core::string<wchar_t>::~string((string<wchar_t> *)0x3cd9cf);
              core::array<irr::core::string<wchar_t>_>::push_back
                        (in_stack_fffffffffffffd20,(string<wchar_t> *)in_stack_fffffffffffffd18);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              core::string<wchar_t>::operator=
                        ((string<wchar_t> *)in_stack_fffffffffffffd38,
                         (wchar_t *)in_stack_fffffffffffffd30);
              local_80 = 0;
            }
          }
          else {
            core::string<wchar_t>::string<wchar_t>
                      ((string<wchar_t> *)in_stack_fffffffffffffd30,
                       (wchar_t *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (u32)((ulong)in_stack_fffffffffffffd20 >> 0x20));
            core::string<wchar_t>::operator+
                      ((string<wchar_t> *)in_stack_fffffffffffffd38,
                       (string<wchar_t> *)in_stack_fffffffffffffd30);
            core::string<wchar_t>::operator=
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (string<wchar_t> *)in_stack_fffffffffffffd20);
            core::string<wchar_t>::~string((string<wchar_t> *)0x3cda8a);
            core::string<wchar_t>::~string((string<wchar_t> *)0x3cda97);
          }
        }
        core::string<wchar_t>::operator+
                  ((string<wchar_t> *)in_stack_fffffffffffffd38,
                   (string<wchar_t> *)in_stack_fffffffffffffd30);
        core::string<wchar_t>::operator=
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (string<wchar_t> *)in_stack_fffffffffffffd20);
        core::string<wchar_t>::~string((string<wchar_t> *)0x3cdae5);
        core::string<wchar_t>::operator+
                  ((string<wchar_t> *)in_stack_fffffffffffffd38,
                   (string<wchar_t> *)in_stack_fffffffffffffd30);
        core::string<wchar_t>::operator=
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (string<wchar_t> *)in_stack_fffffffffffffd20);
        core::string<wchar_t>::~string((string<wchar_t> *)0x3cdb1b);
        core::array<irr::core::string<wchar_t>_>::push_back
                  (in_stack_fffffffffffffd20,(string<wchar_t> *)in_stack_fffffffffffffd18);
      }
      core::string<wchar_t>::~string((string<wchar_t> *)0x3cdb41);
      core::string<wchar_t>::~string((string<wchar_t> *)0x3cdb4e);
      core::string<wchar_t>::~string((string<wchar_t> *)0x3cdb5b);
    }
  }
  return;
}

Assistant:

void CGUIStaticText::breakText()
{
	if (!WordWrap)
		return;

	BrokenText.clear();

	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = getActiveFont();
	if (!font)
		return;

	LastBreakFont = font;

	core::stringw line;
	core::stringw word;
	core::stringw whitespace;
	s32 size = Text.size();
	s32 length = 0;
	s32 elWidth = RelativeRect.getWidth();
	if (Border)
		elWidth -= 2 * skin->getSize(EGDS_TEXT_DISTANCE_X);
	wchar_t c;

	// We have to deal with right-to-left and left-to-right differently
	// However, most parts of the following code is the same, it's just
	// some order and boundaries which change.
	if (!RightToLeft) {
		// regular (left-to-right)
		for (s32 i = 0; i < size; ++i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if (Text[i + 1] == L'\n') { // Windows breaks
					Text.erase(i + 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			bool isWhitespace = (c == L' ' || c == 0);
			if (!isWhitespace) {
				// part of a word
				word += c;
			}

			if (isWhitespace || i == (size - 1)) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (wordlgth > elWidth) {
						// This word is too long to fit in the available space, look for
						// the Unicode Soft HYphen (SHY / 00AD) character for a place to
						// break the word at
						int where = word.findFirst(wchar_t(0x00AD));
						if (where != -1) {
							core::stringw first = word.subString(0, where);
							core::stringw second = word.subString(where, word.size() - where);
							BrokenText.push_back(line + first + L"-");
							const s32 secondLength = font->getDimension(second.c_str()).Width;

							length = secondLength;
							line = second;
						} else {
							// No soft hyphen found, so there's nothing more we can do
							// break to next line
							if (length)
								BrokenText.push_back(line);
							length = wordlgth;
							line = word;
						}
					} else if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line += whitespace;
						line += word;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (isWhitespace) {
					whitespace += c;
				}

				// compute line break
				if (lineBreak) {
					line += whitespace;
					line += word;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			}
		}

		line += whitespace;
		line += word;
		BrokenText.push_back(line);
	} else {
		// right-to-left
		for (s32 i = size; i >= 0; --i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if ((i > 0) && Text[i - 1] == L'\n') { // Windows breaks
					Text.erase(i - 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			if (c == L' ' || c == 0 || i == 0) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line = whitespace + line;
						line = word + line;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (c != 0)
					whitespace = core::stringw(&c, 1) + whitespace;

				// compute line break
				if (lineBreak) {
					line = whitespace + line;
					line = word + line;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			} else {
				// yippee this is a word..
				word = core::stringw(&c, 1) + word;
			}
		}

		line = whitespace + line;
		line = word + line;
		BrokenText.push_back(line);
	}
}